

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.cpp
# Opt level: O3

uint64_t __thiscall DatabaseConfig::get(DatabaseConfig *this,ConfigKey *key)

{
  value_t vVar1;
  bool bVar2;
  reference j;
  const_iterator result_2;
  const_iterator result;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_60;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_40;
  
  local_40.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_40.m_it.array_iterator._M_current = (pointer)0x0;
  local_40.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar1 = (this->config_).m_type;
  local_40.m_object = &this->config_;
  if (vVar1 == object) {
    local_40.m_it.object_iterator._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
         ::find(&((this->config_).m_value.object)->_M_t,&key->key_);
    vVar1 = (this->config_).m_type;
LAB_00154840:
    local_60.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_60.m_it.array_iterator._M_current = (pointer)0x0;
    local_60.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar1 != array) {
      if (vVar1 == object) {
        local_60.m_it.object_iterator._M_node =
             &(((this->config_).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        local_60.m_it.primitive_iterator.m_it = 1;
      }
      goto LAB_00154885;
    }
  }
  else {
    if (vVar1 != array) {
      local_40.m_it.primitive_iterator.m_it = 1;
      goto LAB_00154840;
    }
    local_40.m_it.array_iterator._M_current =
         (((this->config_).m_value.array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_60.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_60.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_60.m_it.array_iterator._M_current =
       (((this->config_).m_value.array)->
       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
LAB_00154885:
  local_60.m_object = &this->config_;
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_40,&local_60);
  if (bVar2) {
    local_60.m_object = (pointer)key->defval_;
  }
  else {
    j = nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator*(&local_40);
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
              (j,(unsigned_long *)&local_60);
  }
  return (uint64_t)local_60.m_object;
}

Assistant:

uint64_t DatabaseConfig::get(const ConfigKey &key) const {
    if (const auto &it = config_.find(key.key()); it != config_.end()) {
        return *it;
    }
    return key.defval();
}